

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh8_factory.cpp
# Opt level: O1

Accel * __thiscall
embree::BVH8Factory::BVH8InstanceMB(BVH8Factory *this,Scene *scene,bool isExpensive)

{
  BVHN<8> *this_00;
  Builder *pBVar1;
  Accel *pAVar2;
  GTypeMask GVar3;
  Intersectors intersectors;
  Intersector16 local_160;
  BVHN<8> *local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  Intersector1 local_128;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  char *local_f8;
  undefined4 local_c0;
  undefined4 uStack_bc;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  char *local_b0;
  char *local_68;
  
  this_00 = (BVHN<8> *)alignedMalloc(0x240,0x10);
  BVHN<8>::BVHN(this_00,(PrimitiveType *)&InstancePrimitive::type,scene);
  local_128.intersect = (IntersectFunc)0x0;
  local_128.occluded = (OccludedFunc)0x0;
  local_138 = 0;
  uStack_130 = 0;
  local_148 = (BVHN<8> *)0x0;
  uStack_140 = 0;
  memset(&local_128.name,0,0xe0);
  local_148 = this_00;
  (*this->BVH8InstanceMBIntersector1)(&local_128);
  (*this->BVH8InstanceMBIntersector4Chunk)((Intersector4 *)&local_160);
  local_f8 = local_160.name;
  local_108 = local_160.intersect._0_4_;
  uStack_104 = local_160.intersect._4_4_;
  uStack_100 = local_160.occluded._0_4_;
  uStack_fc = local_160.occluded._4_4_;
  (*this->BVH8InstanceMBIntersector8Chunk)((Intersector8 *)&local_160);
  local_b0 = local_160.name;
  local_c0 = local_160.intersect._0_4_;
  uStack_bc = local_160.intersect._4_4_;
  uStack_b8 = local_160.occluded._0_4_;
  uStack_b4 = local_160.occluded._4_4_;
  (*this->BVH8InstanceMBIntersector16Chunk)(&local_160);
  local_68 = local_160.name;
  GVar3 = MTY_INSTANCE;
  if (isExpensive) {
    GVar3 = MTY_INSTANCE_EXPENSIVE;
  }
  pBVar1 = (*this->BVH8InstanceMBSceneBuilderSAH)(this_00,scene,GVar3);
  pAVar2 = (Accel *)alignedMalloc(0x180,0x10);
  (pAVar2->super_AccelData).super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)&(pAVar2->super_AccelData).bounds.bounds0.lower.field_0 = 0x7f8000007f800000;
  *(undefined8 *)((long)&(pAVar2->super_AccelData).bounds.bounds0.lower.field_0 + 8) =
       0x7f8000007f800000;
  *(undefined8 *)&(pAVar2->super_AccelData).bounds.bounds0.upper.field_0 = 0xff800000ff800000;
  *(undefined8 *)((long)&(pAVar2->super_AccelData).bounds.bounds0.upper.field_0 + 8) =
       0xff800000ff800000;
  *(undefined8 *)&(pAVar2->super_AccelData).bounds.bounds1.lower.field_0 = 0x7f8000007f800000;
  *(undefined8 *)((long)&(pAVar2->super_AccelData).bounds.bounds1.lower.field_0 + 8) =
       0x7f8000007f800000;
  *(undefined8 *)&(pAVar2->super_AccelData).bounds.bounds1.upper.field_0 = 0xff800000ff800000;
  *(undefined8 *)((long)&(pAVar2->super_AccelData).bounds.bounds1.upper.field_0 + 8) =
       0xff800000ff800000;
  (pAVar2->super_AccelData).type = TY_ACCEL_INSTANCE;
  (pAVar2->super_AccelData).super_RefCount._vptr_RefCount = (_func_int **)&PTR__RefCount_02207ae8;
  memcpy(&(pAVar2->super_AccelData).field_0x58,&local_148,0x118);
  (pAVar2->super_AccelData).super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__AccelInstance_02207a80;
  pAVar2[1].super_AccelData.super_RefCount._vptr_RefCount = (_func_int **)this_00;
  pAVar2[1].super_AccelData.super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i =
       (__int_type_conflict)pBVar1;
  return pAVar2;
}

Assistant:

Accel* BVH8Factory::BVH8InstanceMB(Scene* scene, bool isExpensive)
  {
    BVH8* accel = new BVH8(InstancePrimitive::type,scene);
    Accel::Intersectors intersectors = BVH8InstanceMBIntersectors(accel);
    auto gtype = isExpensive ? Geometry::MTY_INSTANCE_EXPENSIVE : Geometry::MTY_INSTANCE; 
    Builder* builder = BVH8InstanceMBSceneBuilderSAH(accel,scene,gtype);
    return new AccelInstance(accel,builder,intersectors);
  }